

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionBody::ResetSimpleJitLimitAndCallCount(FunctionBody *this)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  FunctionEntryPointInfo *pFVar4;
  FunctionEntryPointInfo *pFVar5;
  undefined4 *puVar6;
  int iVar7;
  uint uVar8;
  
  pFVar4 = GetDefaultFunctionEntryPointInfo(this);
  pFVar5 = (FunctionEntryPointInfo *)
           FunctionProxy::GetAuxPtr((FunctionProxy *)this,SimpleJitEntryPointInfo);
  if (pFVar4 != pFVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1b81,
                                "(GetDefaultFunctionEntryPointInfo() == GetSimpleJitEntryPointInfo())"
                                ,
                                "GetDefaultFunctionEntryPointInfo() == GetSimpleJitEntryPointInfo()"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  FunctionExecutionStateMachine::ResetSimpleJitLimit(&this->executionState);
  uVar1 = (this->executionState).interpretedCount;
  uVar8 = (uint)(this->executionState).simpleJitLimit;
  iVar7 = uVar8 - uVar1;
  if (uVar8 < uVar1 || iVar7 == 0) {
    iVar7 = 0;
  }
  SetSimpleJitCallCount(this,(uint16)iVar7);
  return;
}

Assistant:

void FunctionBody::ResetSimpleJitLimitAndCallCount()
    {
        Assert(GetDefaultFunctionEntryPointInfo() == GetSimpleJitEntryPointInfo());

        executionState.ResetSimpleJitLimit();

        ResetSimpleJitCallCount();
    }